

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-configure.c
# Opt level: O3

int run_test_loop_configure(void)

{
  int iVar1;
  uv_timer_t timer_handle;
  uv_loop_t loop;
  undefined1 auStack_3e8 [152];
  undefined1 local_350 [848];
  
  iVar1 = uv_loop_init(local_350);
  if (iVar1 == 0) {
    iVar1 = uv_loop_configure(local_350,0,0x1b);
    if (iVar1 != 0) goto LAB_001639ef;
    iVar1 = uv_timer_init(local_350,auStack_3e8);
    if (iVar1 != 0) goto LAB_001639f4;
    iVar1 = uv_timer_start(auStack_3e8,timer_cb,10,0);
    if (iVar1 != 0) goto LAB_001639f9;
    iVar1 = uv_run(local_350,0);
    if (iVar1 == 0) {
      iVar1 = uv_loop_close(local_350);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00163a03;
    }
  }
  else {
    run_test_loop_configure_cold_1();
LAB_001639ef:
    run_test_loop_configure_cold_2();
LAB_001639f4:
    run_test_loop_configure_cold_3();
LAB_001639f9:
    run_test_loop_configure_cold_4();
  }
  run_test_loop_configure_cold_5();
LAB_00163a03:
  run_test_loop_configure_cold_6();
  iVar1 = uv_close();
  return iVar1;
}

Assistant:

TEST_IMPL(loop_configure) {
  uv_timer_t timer_handle;
  uv_loop_t loop;
  ASSERT(0 == uv_loop_init(&loop));
#ifdef _WIN32
  ASSERT(UV_ENOSYS == uv_loop_configure(&loop, UV_LOOP_BLOCK_SIGNAL, 0));
#else
  ASSERT(0 == uv_loop_configure(&loop, UV_LOOP_BLOCK_SIGNAL, SIGPROF));
#endif
  ASSERT(0 == uv_timer_init(&loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 10, 0));
  ASSERT(0 == uv_run(&loop, UV_RUN_DEFAULT));
  ASSERT(0 == uv_loop_close(&loop));
  return 0;
}